

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O2

void __thiscall GrcManager::DebugClasses(GrcManager *this,char *pchOutputPath)

{
  GdlRenderer *this_00;
  allocator local_272;
  allocator local_271;
  string staOutputFilename;
  string local_250;
  string local_230;
  ofstream strmOut;
  byte abStack_1f0 [480];
  
  std::__cxx11::string::string((string *)&staOutputFilename,pchOutputPath,(allocator *)&strmOut);
  std::__cxx11::string::append((char *)&staOutputFilename);
  std::ofstream::ofstream(&strmOut);
  this_00 = (GdlRenderer *)&strmOut;
  std::ofstream::open((char *)this_00,(_Ios_Openmode)staOutputFilename._M_dataplus._M_p);
  if ((abStack_1f0[*(long *)(_strmOut + -0x18)] & 5) == 0) {
    if (g_errorList.m_fFatalError == true) {
      std::operator<<((ostream *)&strmOut,"Fatal errors--compilation aborted");
    }
    else {
      GdlRenderer::DebugClasses
                (this_00,(ostream *)&strmOut,&this->m_vpglfcReplcmtClasses,this->m_cpglfcLinear);
    }
    std::ofstream::close();
  }
  else {
    std::__cxx11::string::string((string *)&local_230,"Error in writing to file ",&local_271);
    std::__cxx11::string::string((string *)&local_250,staOutputFilename._M_dataplus._M_p,&local_272)
    ;
    GrcErrorList::AddWarning(&g_errorList,0x1968,(GdlObject *)0x0,&local_230,&local_250);
    std::__cxx11::string::~string((string *)&local_250);
    std::__cxx11::string::~string((string *)&local_230);
  }
  std::ofstream::~ofstream(&strmOut);
  std::__cxx11::string::~string((string *)&staOutputFilename);
  return;
}

Assistant:

void GrcManager::DebugClasses(char * pchOutputPath)
{
	std::string staOutputFilename(pchOutputPath);
	staOutputFilename.append("/dbg_classes.txt");

	std::ofstream strmOut;
	strmOut.open(staOutputFilename.data());
	if (strmOut.fail())
	{
		g_errorList.AddWarning(6504, NULL,
			"Error in writing to file ", staOutputFilename.data());
		return;
	}

	if (g_errorList.AnyFatalErrors())
		strmOut << "Fatal errors--compilation aborted";
	else
	{
		m_prndr->DebugClasses(strmOut, m_vpglfcReplcmtClasses, m_cpglfcLinear);
	}

	strmOut.close();
}